

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
          (VertexArrayVerifier *this,RenderContext *renderCtx,TestLog *log)

{
  CallLogWrapper *this_00;
  ShaderProgram **ppSVar1;
  RenderContext *renderCtx_00;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ShaderProgram *pSVar5;
  char *pcVar6;
  long *plVar7;
  undefined4 extraout_var_00;
  TestError *this_01;
  size_type *psVar8;
  GLSLVersion version;
  long lVar9;
  ProgramSources sources;
  allocator<char> local_18a;
  allocator<char> local_189;
  value_type local_188;
  value_type local_168;
  CallLogWrapper *local_148;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  ProgramSources local_100;
  
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  local_148 = this_00;
  glu::CallLogWrapper::CallLogWrapper(this_00,(Functions *)CONCAT44(extraout_var,iVar2),log);
  (this->super_BufferVerifierBase).m_renderCtx = renderCtx;
  (this->super_BufferVerifierBase).m_log = log;
  (this->super_BufferVerifierBase).super_CallLogWrapper.m_enableLog = true;
  (this->super_BufferVerifierBase)._vptr_BufferVerifierBase =
       (_func_int **)&PTR__VertexArrayVerifier_021ce4e8;
  this->m_program = (ShaderProgram *)0x0;
  this->m_posLoc = 0;
  this->m_byteVecLoc = 0;
  this->m_vao = 0;
  uVar3 = (*renderCtx->_vptr_RenderContext[2])(renderCtx);
  version = GLSL_VERSION_330;
  if ((uVar3 & 0x300) == 0) {
    version = GLSL_VERSION_300_ES;
  }
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx_00 = (this->super_BufferVerifierBase).m_renderCtx;
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,pcVar6,&local_189);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_120);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_168.field_2._M_allocated_capacity = *psVar8;
    local_168.field_2._8_8_ = plVar7[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar8;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,pcVar6,&local_18a);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_140);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_188.field_2._M_allocated_capacity = *psVar8;
    local_188.field_2._8_8_ = plVar7[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar8;
    local_188._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_188._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_188);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx_00,&local_100);
  ppSVar1 = &this->m_program;
  *ppSVar1 = pSVar5;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  if (((*ppSVar1)->m_program).m_info.linkOk != false) {
    iVar2 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[3])();
    lVar9 = CONCAT44(extraout_var_00,iVar2);
    dVar4 = (**(code **)(lVar9 + 0x780))(((*ppSVar1)->m_program).m_program,"a_position");
    this->m_posLoc = dVar4;
    dVar4 = (**(code **)(lVar9 + 0x780))((this->m_program->m_program).m_program,"a_byteVec");
    this->m_byteVecLoc = dVar4;
    (**(code **)(lVar9 + 0x708))(1,&this->m_vao);
    (**(code **)(lVar9 + 0x6c8))(1,&this->m_positionBuf);
    (**(code **)(lVar9 + 0x6c8))(1,&this->m_indexBuf);
    dVar4 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar4,"Initialization failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                    ,0x1ce);
    return;
  }
  glu::operator<<((this->super_BufferVerifierBase).m_log,*ppSVar1);
  pSVar5 = *ppSVar1;
  if (pSVar5 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar5);
    operator_delete(pSVar5,0xd0);
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
             ,0x1c4);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

VertexArrayVerifier::VertexArrayVerifier (glu::RenderContext& renderCtx, tcu::TestLog& log)
	: BufferVerifierBase	(renderCtx, log)
	, m_program				(DE_NULL)
	, m_posLoc				(0)
	, m_byteVecLoc			(0)
	, m_vao					(0)
{
	const glu::ContextType	ctxType		= renderCtx.getType();
	const glu::GLSLVersion	glslVersion	= glu::isContextTypeES(ctxType) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;

	DE_ASSERT(glu::isGLSLVersionSupported(ctxType, glslVersion));

	m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(
		string(glu::getGLSLVersionDeclaration(glslVersion)) + "\n"
		"in highp vec2 a_position;\n"
		"in mediump vec3 a_byteVec;\n"
		"out mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_byteVec = a_byteVec;\n"
		"}\n",

		string(glu::getGLSLVersionDeclaration(glslVersion)) + "\n"
		"in mediump vec3 v_byteVec;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = vec4(v_byteVec, 1.0);\n"
		"}\n"));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		delete m_program;
		TCU_FAIL("Compile failed");
	}

	const glw::Functions& gl = m_renderCtx.getFunctions();
	m_posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_byteVecLoc	= gl.getAttribLocation(m_program->getProgram(), "a_byteVec");

	gl.genVertexArrays(1, &m_vao);
	gl.genBuffers(1, &m_positionBuf);
	gl.genBuffers(1, &m_indexBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Initialization failed");
}